

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O3

void chrono::TriangleNormalsCompute
               (ChVector<int> *norm_indexes,ChVector<int> *vert_indexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               *vertexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *normals
               ,vector<int,_std::allocator<int>_> *accumul)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer piVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar1 = vert_indexes->m_data[1];
  pCVar4 = (vertexes->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = vert_indexes->m_data[0];
  pCVar5 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = vert_indexes->m_data[2];
  dVar20 = pCVar4[iVar1].m_data[1] - pCVar4[iVar2].m_data[1];
  dVar12 = pCVar4[iVar1].m_data[2] - pCVar4[iVar2].m_data[2];
  dVar11 = pCVar4[iVar1].m_data[0] - pCVar4[iVar2].m_data[0];
  dVar7 = pCVar4[iVar3].m_data[1] - pCVar4[iVar2].m_data[1];
  dVar8 = pCVar4[iVar3].m_data[2] - pCVar4[iVar2].m_data[2];
  dVar9 = pCVar4[iVar3].m_data[0] - pCVar4[iVar2].m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar7 * dVar12;
  auVar15 = vfmsub231sd_fma(auVar23,auVar15,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar12;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar8 * dVar11;
  auVar14 = vfmsub231sd_fma(auVar22,auVar17,auVar19);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar11;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar9 * dVar20;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7;
  auVar13 = vfmsub231sd_fma(auVar16,auVar13,auVar18);
  dVar20 = auVar14._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar20 * dVar20;
  auVar14 = vfmadd231sd_fma(auVar14,auVar15,auVar15);
  auVar14 = vfmadd231sd_fma(auVar14,auVar13,auVar13);
  auVar14 = vsqrtsd_avx(auVar14,auVar14);
  bVar10 = 2.2250738585072014e-308 <= auVar14._0_8_;
  iVar1 = norm_indexes->m_data[0];
  dVar12 = 1.0 / auVar14._0_8_;
  dVar11 = (double)((ulong)bVar10 * (long)(auVar15._0_8_ * dVar12) +
                   (ulong)!bVar10 * 0x3ff0000000000000);
  dVar20 = (double)((ulong)bVar10 * (long)(dVar20 * dVar12));
  dVar12 = (double)((ulong)bVar10 * (long)(auVar13._0_8_ * dVar12));
  pCVar5[iVar1].m_data[0] = dVar11 + pCVar5[iVar1].m_data[0];
  pCVar5[iVar1].m_data[1] = dVar20 + pCVar5[iVar1].m_data[1];
  pCVar5[iVar1].m_data[2] = dVar12 + pCVar5[iVar1].m_data[2];
  iVar2 = norm_indexes->m_data[1];
  pCVar5[iVar2].m_data[0] = dVar11 + pCVar5[iVar2].m_data[0];
  pCVar5[iVar2].m_data[1] = dVar20 + pCVar5[iVar2].m_data[1];
  pCVar5[iVar2].m_data[2] = dVar12 + pCVar5[iVar2].m_data[2];
  iVar2 = norm_indexes->m_data[2];
  pCVar5[iVar2].m_data[0] = dVar11 + pCVar5[iVar2].m_data[0];
  pCVar5[iVar2].m_data[1] = dVar20 + pCVar5[iVar2].m_data[1];
  pCVar5[iVar2].m_data[2] = dVar12 + pCVar5[iVar2].m_data[2];
  piVar6 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6[iVar1] = piVar6[iVar1] + 1;
  piVar6[norm_indexes->m_data[1]] = piVar6[norm_indexes->m_data[1]] + 1;
  piVar6[norm_indexes->m_data[2]] = piVar6[norm_indexes->m_data[2]] + 1;
  return;
}

Assistant:

void TriangleNormalsCompute(ChVector<int> norm_indexes,
                            ChVector<int> vert_indexes,
                            std::vector<ChVector<>>& vertexes,
                            std::vector<ChVector<>>& normals,
                            std::vector<int>& accumul) {
    ChVector<> tnorm = Vcross(vertexes[vert_indexes.y()] - vertexes[vert_indexes.x()],
                              vertexes[vert_indexes.z()] - vertexes[vert_indexes.x()])
                           .GetNormalized();
    normals[norm_indexes.x()] += tnorm;
    normals[norm_indexes.y()] += tnorm;
    normals[norm_indexes.z()] += tnorm;
    accumul[norm_indexes.x()] += 1;
    accumul[norm_indexes.y()] += 1;
    accumul[norm_indexes.z()] += 1;
}